

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void __thiscall
pstore::broker::command_processor::command_processor
          (command_processor *this,uint num_read_threads,
          not_null<pstore::maybe<pstore::http::server_status,_void>_*> http_status,
          not_null<std::atomic<bool>_*> uptime_done,seconds delete_threshold)

{
  int iVar1;
  long lVar2;
  
  this->_vptr_command_processor = (_func_int **)&PTR__command_processor_001981a0;
  (this->commands_done_)._M_base._M_i = false;
  (this->http_status_).ptr_ = http_status.ptr_;
  (this->uptime_done_).ptr_ = uptime_done.ptr_;
  (this->delete_threshold_).__r = delete_threshold.__r;
  (this->scavenger_).mut_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->scavenger_).mut_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->scavenger_).mut_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->scavenger_).mut_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->scavenger_).mut_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->scavenger_).ptr_.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->scavenger_).ptr_.super___weak_ptr<pstore::broker::scavenger,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->messages_).mut_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->messages_).mut_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->messages_).mut_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->messages_).mut_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->messages_).mut_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&(this->messages_).cv);
  *(_Elt_pointer *)
   ((long)&(this->messages_).queue_.c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->messages_).queue_.c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (this->messages_).queue_.c.
  super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->messages_).queue_.c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->messages_).queue_.c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->messages_).queue_.c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->messages_).queue_.c.
  super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->messages_).queue_.c.
           super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  (this->messages_).queue_.c.
  super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->messages_).queue_.c.
  super__Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
  ::_M_initialize_map((_Deque_base<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>,_std::allocator<std::unique_ptr<pstore::brokerface::message_type,_std::default_delete<pstore::brokerface::message_type>_>_>_>
                       *)&(this->messages_).queue_,0);
  *(undefined8 *)((long)&(this->cmds_mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->cmds_mut_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->cmds_mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->cmds_mut_).super___mutex_base._M_mutex + 8) = 0;
  (this->cmds_mut_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->cmds_)._M_h._M_buckets = &(this->cmds_)._M_h._M_single_bucket;
  (this->cmds_)._M_h._M_bucket_count = 1;
  (this->cmds_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cmds_)._M_h._M_element_count = 0;
  (this->cmds_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cmds_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cmds_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->num_read_threads_ = num_read_threads;
  this->commits_ = 0;
  lVar2 = 0;
  do {
    if (lVar2 == 200) {
      return;
    }
    iVar1 = strcmp(*(char **)((long)&DAT_00199c58 + lVar2),*(char **)((long)&DAT_00199c30 + lVar2));
    lVar2 = lVar2 + 0x28;
  } while (-1 < iVar1);
  assert_failed("std::is_sorted (std::begin (commands_), std::end (commands_), command_entry_compare)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/broker/command.cpp"
                ,0x4d);
}

Assistant:

command_processor::command_processor (
            unsigned const num_read_threads,
            gsl::not_null<maybe<http::server_status> *> const http_status,
            gsl::not_null<std::atomic<bool> *> const uptime_done,
            std::chrono::seconds const delete_threshold)
                : http_status_{http_status}
                , uptime_done_{uptime_done}
                , delete_threshold_{delete_threshold}
                , num_read_threads_{num_read_threads} {
            PSTORE_ASSERT (std::is_sorted (std::begin (commands_), std::end (commands_),
                                           command_entry_compare));
        }